

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_filter.cpp
# Opt level: O2

void __thiscall
duckdb::AdaptiveFilter::AdaptiveFilter(AdaptiveFilter *this,TableFilterSet *table_filters)

{
  ulong uVar1;
  idx_t idx;
  ulong uVar2;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  *(undefined8 *)
   ((long)&(this->permutation).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->permutation).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->permutation).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->permutation).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->right_random_border = 0;
  this->iteration_count = 0;
  this->swap_idx = 0;
  this->observe_interval = 10;
  this->execute_interval = 0x14;
  this->runtime_sum = 0.0;
  this->prev_mean = 0.0;
  this->observe = false;
  this->warmup = true;
  (this->swap_likeliness).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->swap_likeliness).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->swap_likeliness).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  RandomEngine::RandomEngine(&this->generator,-1);
  ExpressionHeuristics::GetInitialOrder((vector<unsigned_long,_true> *)&local_48,table_filters);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,&local_48);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  for (uVar2 = 1; uVar1 = (table_filters->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count,
      uVar2 < uVar1; uVar2 = uVar2 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x64;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->swap_likeliness,
               (unsigned_long *)&local_48);
  }
  this->right_random_border = uVar1 * 100 - 100;
  return;
}

Assistant:

AdaptiveFilter::AdaptiveFilter(const TableFilterSet &table_filters)
    : observe_interval(10), execute_interval(20), warmup(true) {
	permutation = ExpressionHeuristics::GetInitialOrder(table_filters);
	for (idx_t idx = 1; idx < table_filters.filters.size(); idx++) {
		swap_likeliness.push_back(100);
	}
	right_random_border = 100 * (table_filters.filters.size() - 1);
}